

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O2

Rotation *
iDynTree::Rotation::RotationFromQuaternion(Rotation *__return_storage_ptr__,Vector4 *_quaternion)

{
  Rotation(__return_storage_ptr__);
  fromQuaternion(__return_storage_ptr__,_quaternion);
  return __return_storage_ptr__;
}

Assistant:

Rotation Rotation::RotationFromQuaternion(const iDynTree::Vector4& _quaternion)
    {
        //Taken from "Contributions au contrôle automatique de véhicules aériens"
        //PhD thesis of "Minh Duc HUA"
        //INRIA Sophia Antipolis
        //Equation 3.8 (page 101)

        // Rodriques' formula
        // R = I3 + 2s S(r) + 2S(r)^2,
        Rotation _rotation;
        _rotation.fromQuaternion(_quaternion);
        return _rotation;
    }